

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

BOOL __thiscall
Js::FunctionBody::GetBranchOffsetWithin
          (FunctionBody *this,uint start,uint end,StatementAdjustmentRecord *record)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  StatementAdjustmentRecordList *pSVar5;
  Type *other;
  StatementAdjustmentRecord local_38;
  StatementAdjustmentRecord item;
  int i;
  int count;
  StatementAdjustmentRecord *record_local;
  uint end_local;
  uint start_local;
  FunctionBody *this_local;
  
  if (end <= start) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x13f,"(start < end)","start < end");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pSVar5 = GetStatementAdjustmentRecords(this);
  if (pSVar5 != (StatementAdjustmentRecordList *)0x0) {
    pSVar5 = GetStatementAdjustmentRecords(this);
    item._4_4_ = JsUtil::
                 ReadOnlyList<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_DefaultComparer>
                 ::Count(&pSVar5->
                          super_ReadOnlyList<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_DefaultComparer>
                        );
    for (item.m_byteCodeOffset = 0; (int)item.m_byteCodeOffset < (int)item._4_4_;
        item.m_byteCodeOffset = item.m_byteCodeOffset + 1) {
      pSVar5 = GetStatementAdjustmentRecords(this);
      other = JsUtil::
              List<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(pSVar5,item.m_byteCodeOffset);
      StatementAdjustmentRecord::StatementAdjustmentRecord(&local_38,other);
      uVar3 = StatementAdjustmentRecord::GetByteCodeOffset(&local_38);
      if ((start < uVar3) &&
         (uVar3 = StatementAdjustmentRecord::GetByteCodeOffset(&local_38), uVar3 < end)) {
        record->m_byteCodeOffset = local_38.m_byteCodeOffset;
        record->m_adjustmentType = local_38.m_adjustmentType;
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

BOOL
    FunctionBody::GetBranchOffsetWithin(uint start, uint end, StatementAdjustmentRecord* record)
    {
        Assert(start < end);

        if (!this->GetStatementAdjustmentRecords())
        {
            // No Offset
            return FALSE;
        }

        int count = this->GetStatementAdjustmentRecords()->Count();
        for (int i = 0; i < count; i++)
        {
            StatementAdjustmentRecord item = this->GetStatementAdjustmentRecords()->Item(i);
            if (item.GetByteCodeOffset() > start && item.GetByteCodeOffset() < end)
            {
                *record = item;
                return TRUE;
            }
        }

        // No offset found in the range.
        return FALSE;
    }